

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Input::setError(Input *this,HNode *hnode,Twine *message)

{
  error_category *peVar1;
  
  if (hnode != (HNode *)0x0) {
    yaml::Stream::printError
              ((this->Strm)._M_t.
               super___uniq_ptr_impl<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>.
               _M_t.
               super__Tuple_impl<0UL,_llvm::yaml::Stream_*,_std::default_delete<llvm::yaml::Stream>_>
               .super__Head_base<0UL,_llvm::yaml::Stream_*,_false>._M_head_impl,hnode->_node,message
              );
    peVar1 = (error_category *)std::_V2::generic_category();
    (this->EC)._M_value = 0x16;
    (this->EC)._M_cat = peVar1;
    return;
  }
  __assert_fail("hnode && \"HNode must not be NULL\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                ,0x160,"void llvm::yaml::Input::setError(HNode *, const Twine &)");
}

Assistant:

void Input::setError(HNode *hnode, const Twine &message) {
  assert(hnode && "HNode must not be NULL");
  setError(hnode->_node, message);
}